

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O3

size_t __thiscall dgrminer::labeled_node::support(labeled_node *this,bool new_measures)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  int iVar7;
  bool bVar8;
  uint uVar9;
  iterator iVar10;
  _Base_ptr p_Var11;
  size_t sVar12;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *this_00;
  mapped_type *pmVar13;
  pointer paVar14;
  pointer plVar15;
  size_t extraout_RAX;
  int iVar16;
  uint *in_RCX;
  _Base_ptr p_Var17;
  _Rb_tree_header *p_Var18;
  pointer plVar19;
  undefined4 extraout_EDX;
  int iVar20;
  char unaff_BL;
  unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *this_01;
  array<int,_6UL> *paVar21;
  __normal_iterator<std::array<int,_6UL>_*,_std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>_>
  _Var22;
  uint *puVar23;
  __normal_iterator<std::array<int,_6UL>_*,_std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>_>
  _Var24;
  int iVar25;
  undefined7 in_register_00000031;
  pointer paVar27;
  char *this_02;
  uint *in_R8;
  int iVar28;
  undefined8 in_R9;
  int iVar29;
  size_t sVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int snapshotId;
  allocator_type aStack_2a1;
  vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_> vStack_2a0;
  double dStack_280;
  uint *puStack_278;
  undefined4 uStack_270;
  uint uStack_26c;
  long lStack_268;
  undefined1 auStack_260 [8];
  undefined1 auStack_258 [8];
  _Rb_tree_node_base _Stack_250;
  size_t sStack_230;
  _Hashtable<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  _Stack_228;
  vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_> vStack_1f0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> _Stack_1d8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> _Stack_1a8;
  _Rb_tree_header *p_Stack_178;
  vector<double,_std::allocator<double>_> *pvStack_170;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvStack_168;
  vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *pvStack_160;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvStack_158;
  double dStack_150;
  uint *puStack_148;
  double dStack_140;
  array<int,_4UL> aStack_138;
  _Hashtable<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  _Stack_128;
  vector<double,std::allocator<double>> *pvStack_f0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvStack_e8;
  vector<int,std::allocator<int>> *pvStack_e0;
  vector<int,std::allocator<int>> *pvStack_d8;
  vector<double,std::allocator<double>> *pvStack_d0;
  vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *pvStack_c8;
  ulong uStack_c0;
  double dStack_b8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvStack_b0;
  double dStack_a8;
  double dStack_a0;
  void *apvStack_98 [3];
  void *apvStack_80 [3];
  unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *puStack_68;
  _Rb_tree_color *p_Stack_60;
  _Rb_tree_header *p_Stack_58;
  size_t sStack_50;
  _Rb_tree_node_base *p_Stack_48;
  byte bStack_30;
  _Rb_tree_color local_2c;
  _Rb_tree_color *p_Var26;
  
  if ((int)CONCAT71(in_register_00000031,new_measures) == 0) {
    sVar30 = (this->occurrences)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  else {
    p_Var11 = (this->occurrences)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->occurrences)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var11 == p_Var1) {
      sVar30 = 0;
    }
    else {
      this_01 = &this->multiple_occurrences;
      sVar30 = 0;
      do {
        local_2c = p_Var11[1]._M_color;
        p_Var26 = &local_2c;
        iVar10 = std::
                 _Hashtable<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&this_01->_M_h,(key_type *)&local_2c);
        iVar25 = (int)p_Var26;
        iVar28 = (int)in_R9;
        if (iVar10.
            super__Node_iterator_base<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          this_02 = "_Map_base::at";
          dStack_b8 = (double)std::__throw_out_of_range("_Map_base::at");
          vStack_2a0.
          super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          vStack_2a0.
          super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_2a0.
          super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          _Var22._M_current =
               (((PartialUnion *)this_02)->nodes).
               super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          paVar21 = (((PartialUnion *)this_02)->nodes).
                    super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          uStack_26c = (uint)bStack_30;
          puStack_278 = in_RCX;
          uStack_270 = extraout_EDX;
          puStack_148 = in_R8;
          dStack_a8 = extraout_XMM1_Qa;
          puStack_68 = this_01;
          p_Stack_60 = &local_2c;
          p_Stack_58 = p_Var1;
          sStack_50 = sVar30;
          p_Stack_48 = p_Var11;
          if (paVar21 == _Var22._M_current) {
            uVar32 = 0;
            lVar31 = 0;
            goto LAB_0015dda2;
          }
          p_Var1 = &(((PartialUnion *)this_02)->labelIsChange)._M_t._M_impl.super__Rb_tree_header;
          sVar30 = 0;
          goto LAB_0015dcec;
        }
        sVar30 = sVar30 + *(long *)((long)iVar10.
                                          super__Node_iterator_base<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_false>
                                          ._M_cur + 0x38);
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      } while ((_Rb_tree_header *)p_Var11 != p_Var1);
    }
  }
  return sVar30;
LAB_0015dcec:
  do {
    p_Var11 = (((PartialUnion *)this_02)->labelIsChange)._M_t._M_impl.super__Rb_tree_header.
              _M_header._M_parent;
    iVar29 = _Var22._M_current[sVar30]._M_elems[2];
    p_Var17 = &p_Var1->_M_header;
    if (p_Var11 == (_Base_ptr)0x0) {
LAB_0015dd3a:
      PartialUnion::addLabeledNodeOccurrence
                ((PartialUnion *)this_02,sVar30,iVar29,_Var22._M_current[sVar30]._M_elems[4],
                 &vStack_2a0,SUB41(uStack_26c,0),_Var22._M_current[sVar30]._M_elems[0] + -1);
      _Var22._M_current =
           (((PartialUnion *)this_02)->nodes).
           super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
      paVar21 = (((PartialUnion *)this_02)->nodes).
                super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      do {
        if (iVar29 <= (int)*(size_t *)(p_Var11 + 1)) {
          p_Var17 = p_Var11;
        }
        p_Var11 = (&p_Var11->_M_left)[(int)*(size_t *)(p_Var11 + 1) < iVar29];
      } while (p_Var11 != (_Base_ptr)0x0);
      if ((((_Rb_tree_header *)p_Var17 == p_Var1) ||
          (iVar29 < (int)((_Rb_tree_header *)p_Var17)->_M_node_count)) ||
         (*(undefined1 *)((long)&((_Rb_tree_header *)p_Var17)->_M_node_count + 4) != '\0'))
      goto LAB_0015dd3a;
    }
    sVar30 = sVar30 + 1;
    lVar31 = (long)paVar21 - (long)_Var22._M_current;
    uVar32 = (lVar31 >> 3) * -0x5555555555555555;
  } while (sVar30 < uVar32);
LAB_0015dda2:
  if ((char)uStack_270 != '\0') goto LAB_0015df2d;
  _Stack_128._M_buckets = (__buckets_ptr)CONCAT44(_Stack_128._M_buckets._4_4_,iVar25);
  auStack_258 = (undefined1  [8])&vStack_2a0;
  auStack_260._0_4_ = iVar25;
  _Stack_250._0_8_ = this_02;
  _Stack_128._M_bucket_count = (size_type)auStack_258;
  _Stack_128._M_before_begin._M_nxt = (_Hash_node_base *)this_02;
  if (0 < (long)uVar32 >> 2) {
    lVar33 = ((long)uVar32 >> 2) + 1;
    lVar31 = (long)paVar21 - (long)_Var22._M_current;
    do {
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::computeFrequentVerticesAndRemoveTheInfrequentOnes(int,double,bool,dgrminer::results_crate*,dgrminer::results_crate_anomalies*,int,bool,bool,double)::$_0>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::computeFrequentVerticesAndRemoveTheInfrequentOnes(int,double,bool,dgrminer::results_crate*,dgrminer::results_crate_anomalies*,int,bool,bool,double)::__0>
                            *)auStack_260,_Var22);
      _Var24._M_current = _Var22._M_current;
      if (bVar8) goto LAB_0015ded3;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::computeFrequentVerticesAndRemoveTheInfrequentOnes(int,double,bool,dgrminer::results_crate*,dgrminer::results_crate_anomalies*,int,bool,bool,double)::$_0>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::computeFrequentVerticesAndRemoveTheInfrequentOnes(int,double,bool,dgrminer::results_crate*,dgrminer::results_crate_anomalies*,int,bool,bool,double)::__0>
                            *)auStack_260,_Var22._M_current + 1);
      _Var24._M_current = _Var22._M_current + 1;
      if (bVar8) goto LAB_0015ded3;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::computeFrequentVerticesAndRemoveTheInfrequentOnes(int,double,bool,dgrminer::results_crate*,dgrminer::results_crate_anomalies*,int,bool,bool,double)::$_0>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::computeFrequentVerticesAndRemoveTheInfrequentOnes(int,double,bool,dgrminer::results_crate*,dgrminer::results_crate_anomalies*,int,bool,bool,double)::__0>
                            *)auStack_260,_Var22._M_current + 2);
      _Var24._M_current = _Var22._M_current + 2;
      if (bVar8) goto LAB_0015ded3;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::computeFrequentVerticesAndRemoveTheInfrequentOnes(int,double,bool,dgrminer::results_crate*,dgrminer::results_crate_anomalies*,int,bool,bool,double)::$_0>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::computeFrequentVerticesAndRemoveTheInfrequentOnes(int,double,bool,dgrminer::results_crate*,dgrminer::results_crate_anomalies*,int,bool,bool,double)::__0>
                            *)auStack_260,_Var22._M_current + 3);
      _Var24._M_current = _Var22._M_current + 3;
      if (bVar8) goto LAB_0015ded3;
      _Var22._M_current = _Var22._M_current + 4;
      lVar33 = lVar33 + -1;
      lVar31 = lVar31 + -0x60;
    } while (1 < lVar33);
  }
  lVar31 = (lVar31 >> 3) * -0x5555555555555555;
  if (lVar31 == 1) {
LAB_0015debd:
    bVar8 = __gnu_cxx::__ops::
            _Iter_pred<dgrminer::PartialUnion::computeFrequentVerticesAndRemoveTheInfrequentOnes(int,double,bool,dgrminer::results_crate*,dgrminer::results_crate_anomalies*,int,bool,bool,double)::$_0>
            ::operator()((_Iter_pred<dgrminer::PartialUnion::computeFrequentVerticesAndRemoveTheInfrequentOnes(int,double,bool,dgrminer::results_crate*,dgrminer::results_crate_anomalies*,int,bool,bool,double)::__0>
                          *)auStack_260,_Var22);
    _Var24._M_current = _Var22._M_current;
    if (!bVar8) {
      _Var24._M_current = paVar21;
    }
LAB_0015ded3:
    _Var22._M_current = _Var24._M_current + 1;
    if (_Var22._M_current != paVar21 && _Var24._M_current != paVar21) {
      do {
        bVar8 = __gnu_cxx::__ops::
                _Iter_pred<dgrminer::PartialUnion::computeFrequentVerticesAndRemoveTheInfrequentOnes(int,double,bool,dgrminer::results_crate*,dgrminer::results_crate_anomalies*,int,bool,bool,double)::$_0>
                ::operator()((_Iter_pred<dgrminer::PartialUnion::computeFrequentVerticesAndRemoveTheInfrequentOnes(int,double,bool,dgrminer::results_crate*,dgrminer::results_crate_anomalies*,int,bool,bool,double)::__0>
                              *)&_Stack_128,_Var22);
        if (!bVar8) {
          *(undefined8 *)((_Var24._M_current)->_M_elems + 4) =
               *(undefined8 *)((_Var22._M_current)->_M_elems + 4);
          uVar2 = *(undefined8 *)((_Var22._M_current)->_M_elems + 2);
          *(undefined8 *)(_Var24._M_current)->_M_elems =
               *(undefined8 *)(_Var22._M_current)->_M_elems;
          *(undefined8 *)((_Var24._M_current)->_M_elems + 2) = uVar2;
          _Var24._M_current = _Var24._M_current + 1;
        }
        _Var22._M_current = _Var22._M_current + 1;
      } while (_Var22._M_current != paVar21);
    }
  }
  else {
    if (lVar31 == 2) {
LAB_0015dea3:
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::computeFrequentVerticesAndRemoveTheInfrequentOnes(int,double,bool,dgrminer::results_crate*,dgrminer::results_crate_anomalies*,int,bool,bool,double)::$_0>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::computeFrequentVerticesAndRemoveTheInfrequentOnes(int,double,bool,dgrminer::results_crate*,dgrminer::results_crate_anomalies*,int,bool,bool,double)::__0>
                            *)auStack_260,_Var22);
      _Var24._M_current = _Var22._M_current;
      if (!bVar8) {
        _Var22._M_current = _Var22._M_current + 1;
        goto LAB_0015debd;
      }
      goto LAB_0015ded3;
    }
    _Var24._M_current = paVar21;
    if (lVar31 == 3) {
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::computeFrequentVerticesAndRemoveTheInfrequentOnes(int,double,bool,dgrminer::results_crate*,dgrminer::results_crate_anomalies*,int,bool,bool,double)::$_0>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::computeFrequentVerticesAndRemoveTheInfrequentOnes(int,double,bool,dgrminer::results_crate*,dgrminer::results_crate_anomalies*,int,bool,bool,double)::__0>
                            *)auStack_260,_Var22);
      _Var24._M_current = _Var22._M_current;
      if (!bVar8) {
        _Var22._M_current = _Var22._M_current + 1;
        goto LAB_0015dea3;
      }
      goto LAB_0015ded3;
    }
  }
  if (_Var24._M_current !=
      (((PartialUnion *)this_02)->nodes).
      super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (((PartialUnion *)this_02)->nodes).
    super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish = _Var24._M_current;
  }
LAB_0015df2d:
  if (vStack_2a0.super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      vStack_2a0.super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar32 = (ulong)iVar25;
    pvStack_160 = (vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *)
                  (puStack_278 + 2);
    dStack_150 = (double)iVar28;
    pvStack_168 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puStack_278 + 0xe);
    pvStack_170 = (vector<double,_std::allocator<double>_> *)(puStack_278 + 0x14);
    pvStack_158 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)(puStack_278 + 0x20);
    p_Var1 = &(((PartialUnion *)this_02)->antecedentLabelsOfLabels)._M_t._M_impl.
              super__Rb_tree_header;
    lStack_268 = (long)iVar28;
    pvStack_f0 = (vector<double,std::allocator<double>> *)(puStack_278 + 0x1a);
    pvStack_e8 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)(puStack_278 + 0x26);
    pvStack_b0 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)(puStack_148 + 0x20);
    p_Stack_178 = &(((PartialUnion *)this_02)->dummyLabelsOfLabels)._M_t._M_impl.
                   super__Rb_tree_header;
    pvStack_c8 = (vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *)
                 (puStack_148 + 2);
    pvStack_d0 = (vector<double,std::allocator<double>> *)(puStack_148 + 0x1a);
    pvStack_d8 = (vector<int,std::allocator<int>> *)(puStack_148 + 0x14);
    pvStack_e0 = (vector<int,std::allocator<int>> *)(puStack_148 + 0xe);
    sVar30 = 0;
    puVar23 = puStack_278;
    uStack_c0 = uVar32;
    do {
      sVar12 = support(vStack_2a0.
                       super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                       ._M_impl.super__Vector_impl_data._M_start + sVar30,
                       ((PartialUnion *)this_02)->new_measures);
      lVar31 = lStack_268;
      if (uVar32 <= sVar12) {
        if ((char)uStack_270 == '\0') {
          uVar9 = *puVar23;
          *puVar23 = uVar9 + 1;
          _Stack_128._M_buckets = (__buckets_ptr)(ulong)(uVar9 + 1);
          _Stack_128._M_bucket_count =
               CONCAT44(vStack_2a0.
                        super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                        ._M_impl.super__Vector_impl_data._M_start[sVar30].changetime,
                        vStack_2a0.
                        super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                        ._M_impl.super__Vector_impl_data._M_start[sVar30].label);
          iVar3._M_current = *(array<int,_4UL> **)(puVar23 + 4);
          if (iVar3._M_current == *(array<int,_4UL> **)(puVar23 + 6)) {
            std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>::
            _M_realloc_insert<std::array<int,4ul>const&>
                      (pvStack_160,iVar3,(array<int,_4UL> *)&_Stack_128);
          }
          else {
            *(__buckets_ptr *)(iVar3._M_current)->_M_elems = _Stack_128._M_buckets;
            *(size_type *)((iVar3._M_current)->_M_elems + 2) = _Stack_128._M_bucket_count;
            *(long *)(puVar23 + 4) = *(long *)(puVar23 + 4) + 0x10;
          }
          auStack_260 = (undefined1  [8])
                        support(vStack_2a0.
                                super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                                ._M_impl.super__Vector_impl_data._M_start + sVar30,
                                ((PartialUnion *)this_02)->new_measures);
          iVar4._M_current = *(unsigned_long **)(puVar23 + 0x10);
          if (iVar4._M_current == *(unsigned_long **)(puVar23 + 0x12)) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>(pvStack_168,iVar4,(unsigned_long *)auStack_260);
          }
          else {
            *iVar4._M_current = (unsigned_long)auStack_260;
            *(unsigned_long **)(puVar23 + 0x10) = iVar4._M_current + 1;
          }
          sVar12 = support(vStack_2a0.
                           super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                           ._M_impl.super__Vector_impl_data._M_start + sVar30,
                           ((PartialUnion *)this_02)->new_measures);
          auVar36._8_4_ = (int)(sVar12 >> 0x20);
          auVar36._0_8_ = sVar12;
          auVar36._12_4_ = 0x45300000;
          auStack_260 = (undefined1  [8])
                        (((auVar36._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)sVar12) - 4503599627370496.0)) /
                        dStack_150);
          iVar5._M_current = *(double **)(puVar23 + 0x16);
          if (iVar5._M_current == *(double **)(puVar23 + 0x18)) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (pvStack_170,iVar5,(double *)auStack_260);
          }
          else {
            *iVar5._M_current = (double)auStack_260;
            *(double **)(puVar23 + 0x16) = iVar5._M_current + 1;
          }
          std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
                    ((vector<int,std::allocator<int>> *)auStack_260,
                     vStack_2a0.
                     super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                     ._M_impl.super__Vector_impl_data._M_start[sVar30].occurrences._M_t._M_impl.
                     super__Rb_tree_header._M_header._M_left,
                     (_Rb_tree_const_iterator<int>)
                     &vStack_2a0.
                      super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                      ._M_impl.super__Vector_impl_data._M_start[sVar30].occurrences._M_t._M_impl.
                      super__Rb_tree_header,(allocator_type *)&_Stack_1a8);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::push_back(pvStack_158,(value_type *)auStack_260);
          if (auStack_260 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_260);
          }
        }
        else {
          p_Var11 = (((PartialUnion *)this_02)->antecedentLabelsOfLabels)._M_t._M_impl.
                    super__Rb_tree_header._M_header._M_parent;
          iVar25 = -100;
          if (p_Var11 != (_Base_ptr)0x0) {
            iVar29 = vStack_2a0.
                     super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                     ._M_impl.super__Vector_impl_data._M_start[sVar30].label;
            p_Var17 = &p_Var1->_M_header;
            do {
              if (iVar29 <= (int)*(size_t *)(p_Var11 + 1)) {
                p_Var17 = p_Var11;
              }
              p_Var11 = (&p_Var11->_M_left)[(int)*(size_t *)(p_Var11 + 1) < iVar29];
            } while (p_Var11 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var17 != p_Var1) &&
               ((int)((_Rb_tree_header *)p_Var17)->_M_node_count <= iVar29)) {
              iVar25 = *(int *)((long)&((_Rb_tree_header *)p_Var17)->_M_node_count + 4);
            }
          }
          iVar29 = vStack_2a0.
                   super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                   ._M_impl.super__Vector_impl_data._M_start[sVar30].changetime;
          iVar16 = -iVar29;
          if (0 < iVar29) {
            iVar16 = iVar29;
          }
          vStack_1f0.
          super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vStack_1f0.
          super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          vStack_1f0.
          super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          _Stack_1a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          _Stack_1a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          _Stack_1a8._M_impl.super__Rb_tree_header._M_header._M_left =
               &_Stack_1a8._M_impl.super__Rb_tree_header._M_header;
          _Stack_1a8._M_impl.super__Rb_tree_header._M_node_count = 0;
          _Stack_128._M_buckets = &_Stack_128._M_single_bucket;
          _Stack_128._M_bucket_count = 1;
          _Stack_128._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          _Stack_128._M_element_count = 0;
          _Stack_128._M_rehash_policy._M_max_load_factor = 1.0;
          _Stack_128._M_rehash_policy._M_next_resize = 0;
          _Stack_128._M_single_bucket = (__node_base_ptr)0x0;
          _Stack_1a8._M_impl.super__Rb_tree_header._M_header._M_right =
               _Stack_1a8._M_impl.super__Rb_tree_header._M_header._M_left;
          if (iVar25 == -1) {
            if (iVar28 == 0) {
LAB_0015e491:
              iVar29 = 0;
            }
            else {
              lVar33 = 0;
              do {
                auStack_260._0_4_ = (int)lVar33;
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                _M_insert_unique<int>(&_Stack_1a8,(int *)auStack_260);
                lVar33 = lVar33 + 1;
                iVar29 = iVar28;
              } while (lVar31 != lVar33);
            }
          }
          else {
            paVar14 = (((PartialUnion *)this_02)->nodes).
                      super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((((PartialUnion *)this_02)->nodes).
                super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish != paVar14) {
              uVar32 = 0;
              do {
                p_Var11 = (((PartialUnion *)this_02)->antecedentLabelsOfLabels)._M_t._M_impl.
                          super__Rb_tree_header._M_header._M_parent;
                iVar29 = -100;
                if (p_Var11 != (_Base_ptr)0x0) {
                  iVar20 = paVar14[uVar32]._M_elems[2];
                  p_Var17 = &p_Var1->_M_header;
                  do {
                    if (iVar20 <= (int)*(size_t *)(p_Var11 + 1)) {
                      p_Var17 = p_Var11;
                    }
                    p_Var11 = (&p_Var11->_M_left)[(int)*(size_t *)(p_Var11 + 1) < iVar20];
                  } while (p_Var11 != (_Base_ptr)0x0);
                  if (((_Rb_tree_header *)p_Var17 != p_Var1) &&
                     ((int)((_Rb_tree_header *)p_Var17)->_M_node_count <= iVar20)) {
                    iVar29 = *(int *)((long)&((_Rb_tree_header *)p_Var17)->_M_node_count + 4);
                  }
                }
                if (iVar29 == iVar25) {
                  paVar14 = paVar14 + uVar32;
                  iVar29 = paVar14->_M_elems[4];
                  iVar20 = -iVar29;
                  if (0 < iVar29) {
                    iVar20 = iVar29;
                  }
                  if (iVar16 == iVar20) {
                    if (((PartialUnion *)this_02)->new_measures == true) {
                      auStack_260._0_4_ = paVar14->_M_elems[0] + -1;
                      this_00 = &std::__detail::
                                 _Map_base<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 ::operator[]((_Map_base<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                               *)&_Stack_128,(key_type *)auStack_260)->_M_t;
                      _Stack_1d8._M_impl._0_4_ = SUB84(uVar32,0);
                      std::
                      _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      ::_M_insert_unique<int>(this_00,(int *)&_Stack_1d8);
                      auStack_260._0_4_ =
                           (((PartialUnion *)this_02)->nodes).
                           super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar32]._M_elems[0] + -1;
                      std::
                      _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      ::_M_insert_unique<int>(&_Stack_1a8,(int *)auStack_260);
                    }
                    else if (bStack_30 == 0) {
                      auStack_260._0_4_ = paVar14->_M_elems[0] + -1;
                      std::
                      _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      ::_M_insert_unique<int>(&_Stack_1a8,(int *)auStack_260);
                    }
                    else {
                      auStack_260._0_4_ =
                           (((PartialUnion *)this_02)->mappingSnapshotsToGraphs).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)paVar14->_M_elems[0] + -1];
                      std::
                      _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      ::_M_insert_unique<int>(&_Stack_1a8,(int *)auStack_260);
                    }
                  }
                }
                uVar32 = uVar32 + 1;
                paVar14 = (((PartialUnion *)this_02)->nodes).
                          super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              } while (uVar32 < (ulong)(((long)(((PartialUnion *)this_02)->nodes).
                                               super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)paVar14 >> 3) * -0x5555555555555555));
            }
            if (((PartialUnion *)this_02)->new_measures == false) {
              iVar29 = (int)_Stack_1a8._M_impl.super__Rb_tree_header._M_node_count;
            }
            else {
              if ((_Rb_tree_header *)_Stack_1a8._M_impl.super__Rb_tree_header._M_header._M_left ==
                  &_Stack_1a8._M_impl.super__Rb_tree_header) goto LAB_0015e491;
              iVar29 = 0;
              p_Var11 = _Stack_1a8._M_impl.super__Rb_tree_header._M_header._M_left;
              do {
                auStack_260._0_4_ = p_Var11[1]._M_color;
                pmVar13 = std::__detail::
                          _Map_base<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&_Stack_128,(key_type *)auStack_260);
                iVar29 = iVar29 + (int)(pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
                p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
              } while ((_Rb_tree_header *)p_Var11 != &_Stack_1a8._M_impl.super__Rb_tree_header);
            }
          }
          sVar12 = support(vStack_2a0.
                           super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                           ._M_impl.super__Vector_impl_data._M_start + sVar30,
                           ((PartialUnion *)this_02)->new_measures);
          puVar23 = puStack_278;
          auVar34._8_4_ = (int)(sVar12 >> 0x20);
          auVar34._0_8_ = sVar12;
          auVar34._12_4_ = 0x45300000;
          dStack_a0 = (double)iVar29;
          dStack_140 = ((auVar34._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)sVar12) - 4503599627370496.0)) / dStack_a0;
          if (dStack_b8 <= dStack_140) {
            aStack_138._M_elems[0] = *puStack_278 + 1;
            *puStack_278 = aStack_138._M_elems[0];
            aStack_138._M_elems[1] = 0;
            aStack_138._M_elems[2] =
                 vStack_2a0.
                 super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                 ._M_impl.super__Vector_impl_data._M_start[sVar30].label;
            aStack_138._M_elems[3] =
                 vStack_2a0.
                 super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                 ._M_impl.super__Vector_impl_data._M_start[sVar30].changetime;
            iVar3._M_current = *(array<int,_4UL> **)(puStack_278 + 4);
            if (iVar3._M_current == *(array<int,_4UL> **)(puStack_278 + 6)) {
              std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>::
              _M_realloc_insert<std::array<int,4ul>const&>(pvStack_160,iVar3,&aStack_138);
            }
            else {
              *(ulong *)(iVar3._M_current)->_M_elems = (ulong)(uint)aStack_138._M_elems[0];
              *(ulong *)((iVar3._M_current)->_M_elems + 2) =
                   CONCAT44(aStack_138._M_elems[3],aStack_138._M_elems[2]);
              *(long *)(puStack_278 + 4) = *(long *)(puStack_278 + 4) + 0x10;
            }
            auStack_260 = (undefined1  [8])
                          support(vStack_2a0.
                                  super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                                  ._M_impl.super__Vector_impl_data._M_start + sVar30,
                                  ((PartialUnion *)this_02)->new_measures);
            iVar4._M_current = *(unsigned_long **)(puVar23 + 0x10);
            if (iVar4._M_current == *(unsigned_long **)(puVar23 + 0x12)) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_realloc_insert<unsigned_long>(pvStack_168,iVar4,(unsigned_long *)auStack_260);
            }
            else {
              *iVar4._M_current = (unsigned_long)auStack_260;
              *(unsigned_long **)(puVar23 + 0x10) = iVar4._M_current + 1;
            }
            sVar12 = vStack_2a0.
                     super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                     ._M_impl.super__Vector_impl_data._M_start[sVar30].occurrences._M_t._M_impl.
                     super__Rb_tree_header._M_node_count;
            auVar37._0_8_ = (double)CONCAT44(0x43300000,(int)sVar12);
            auVar37._8_4_ = (int)(sVar12 >> 0x20);
            auVar37._12_4_ = 0x45300000;
            auStack_260 = (undefined1  [8])
                          (((auVar37._8_8_ - 1.9342813113834067e+25) +
                           (auVar37._0_8_ - 4503599627370496.0)) / dStack_150);
            iVar5._M_current = *(double **)(puVar23 + 0x16);
            if (iVar5._M_current == *(double **)(puVar23 + 0x18)) {
              std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                        (pvStack_170,iVar5,(double *)auStack_260);
            }
            else {
              *iVar5._M_current = (double)auStack_260;
              *(double **)(puVar23 + 0x16) = iVar5._M_current + 1;
            }
            iVar5._M_current = *(double **)(puVar23 + 0x1c);
            if (iVar5._M_current == *(double **)(puVar23 + 0x1e)) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (pvStack_f0,iVar5,&dStack_140);
            }
            else {
              *iVar5._M_current = dStack_140;
              *(double **)(puVar23 + 0x1c) = iVar5._M_current + 1;
            }
            std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
                      ((vector<int,std::allocator<int>> *)apvStack_98,
                       vStack_2a0.
                       super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                       ._M_impl.super__Vector_impl_data._M_start[sVar30].occurrences._M_t._M_impl.
                       super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<int>)
                       &vStack_2a0.
                        super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                        ._M_impl.super__Vector_impl_data._M_start[sVar30].occurrences._M_t._M_impl.
                        super__Rb_tree_header,(allocator_type *)auStack_260);
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::push_back(pvStack_158,(value_type *)apvStack_98);
            std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
                      ((vector<int,std::allocator<int>> *)apvStack_80,
                       (_Rb_tree_const_iterator<int>)
                       _Stack_1a8._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<int>)&_Stack_1a8._M_impl.super__Rb_tree_header,
                       (allocator_type *)auStack_260);
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::push_back(pvStack_e8,(value_type *)apvStack_80);
            if (unaff_BL != '\0') {
              if (vStack_2a0.
                  super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                  ._M_impl.super__Vector_impl_data._M_start[sVar30].changetime == 0) {
                _Stack_250._0_8_ = _Stack_250._0_8_ & 0xffffffff00000000;
                _Stack_250._M_parent = (_Base_ptr)0x0;
                _Stack_250._M_left = &_Stack_250;
                sStack_230 = 0;
                _Stack_228._M_buckets = &_Stack_228._M_single_bucket;
                _Stack_228._M_bucket_count = 1;
                _Stack_228._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                _Stack_228._M_element_count = 0;
                _Stack_228._M_rehash_policy._M_max_load_factor = 1.0;
                _Stack_228._M_rehash_policy._M_next_resize = 0;
                _Stack_228._M_single_bucket = (__node_base_ptr)0x0;
                p_Var11 = (((PartialUnion *)this_02)->dummyLabelsOfLabels)._M_t._M_impl.
                          super__Rb_tree_header._M_header._M_parent;
                uVar9 = 0xffffff9c;
                if (p_Var11 != (_Base_ptr)0x0) {
                  iVar25 = vStack_2a0.
                           super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                           ._M_impl.super__Vector_impl_data._M_start[sVar30].label;
                  p_Var18 = p_Stack_178;
                  do {
                    if (iVar25 <= (int)*(size_t *)(p_Var11 + 1)) {
                      p_Var18 = (_Rb_tree_header *)p_Var11;
                    }
                    p_Var11 = (&p_Var11->_M_left)[(int)*(size_t *)(p_Var11 + 1) < iVar25];
                  } while (p_Var11 != (_Base_ptr)0x0);
                  if ((p_Var18 != p_Stack_178) && ((int)p_Var18->_M_node_count <= iVar25)) {
                    uVar9 = *(uint *)((long)&p_Var18->_M_node_count + 4);
                  }
                }
                auStack_260 = (undefined1  [8])((ulong)uVar9 << 0x20);
                _Stack_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                _Stack_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                _Stack_1d8._M_impl.super__Rb_tree_header._M_header._M_left =
                     &_Stack_1d8._M_impl.super__Rb_tree_header._M_header;
                _Stack_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
                _Stack_250._M_right = _Stack_250._M_left;
                _Stack_1d8._M_impl.super__Rb_tree_header._M_header._M_right =
                     _Stack_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
                if (bStack_30 == 0) {
                  if (iVar28 != 0) {
                    lVar31 = 0;
                    do {
                      dStack_280 = (double)CONCAT44(dStack_280._4_4_,(int)lVar31);
                      std::
                      _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      ::_M_insert_unique<int>(&_Stack_1d8,(int *)&dStack_280);
                      lVar31 = lVar31 + 1;
                    } while (lStack_268 != lVar31);
                  }
                }
                else if (iVar28 != 0) {
                  lVar33 = 0;
                  lVar31 = lStack_268;
                  do {
                    dStack_280 = (double)CONCAT44(dStack_280._4_4_,
                                                  *(undefined4 *)
                                                   ((long)(((PartialUnion *)this_02)->
                                                          mappingSnapshotsToGraphs).
                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start +
                                                  (lVar33 >> 0x1e)));
                    std::
                    _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                    _M_insert_unique<int>(&_Stack_1d8,(int *)&dStack_280);
                    lVar33 = lVar33 + 0x100000000;
                    lVar31 = lVar31 + -1;
                  } while (lVar31 != 0);
                }
                std::
                __set_difference<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (_Stack_1d8._M_impl.super__Rb_tree_header._M_header._M_left,
                           &_Stack_1d8._M_impl.super__Rb_tree_header,
                           vStack_2a0.
                           super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                           ._M_impl.super__Vector_impl_data._M_start[sVar30].occurrences._M_t.
                           _M_impl.super__Rb_tree_header._M_header._M_left,
                           &vStack_2a0.
                            super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                            ._M_impl.super__Vector_impl_data._M_start[sVar30].occurrences._M_t.
                            _M_impl.super__Rb_tree_header,auStack_258,&_Stack_250);
                if (sStack_230 != 0) {
                  std::vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>::
                  push_back(&vStack_1f0,(value_type *)auStack_260);
                }
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                ~_Rb_tree(&_Stack_1d8);
                std::
                _Hashtable<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::~_Hashtable(&_Stack_228);
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                           *)auStack_258);
              }
              else {
                paVar14 = (((PartialUnion *)this_02)->nodes).
                          super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                paVar27 = (((PartialUnion *)this_02)->nodes).
                          super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                if (paVar27 != paVar14) {
                  uVar32 = 0;
                  do {
                    iVar29 = paVar14[uVar32]._M_elems[2];
                    p_Var11 = (((PartialUnion *)this_02)->antecedentLabelsOfLabels)._M_t._M_impl.
                              super__Rb_tree_header._M_header._M_parent;
                    iVar20 = -100;
                    p_Var17 = &p_Var1->_M_header;
                    if (p_Var11 != (_Base_ptr)0x0) {
                      do {
                        if (iVar29 <= (int)p_Var11[1]._M_color) {
                          p_Var17 = p_Var11;
                        }
                        p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < iVar29];
                      } while (p_Var11 != (_Base_ptr)0x0);
                      if (((_Rb_tree_header *)p_Var17 != p_Var1) &&
                         ((int)p_Var17[1]._M_color <= iVar29)) {
                        iVar20 = *(int *)&p_Var17[1].field_0x4;
                      }
                    }
                    if (iVar20 == iVar25) {
                      iVar20 = paVar14[uVar32]._M_elems[4];
                      iVar7 = -iVar20;
                      if (0 < iVar20) {
                        iVar7 = iVar20;
                      }
                      if ((iVar16 == iVar7) &&
                         ((vStack_2a0.
                           super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                           ._M_impl.super__Vector_impl_data._M_start[sVar30].label != iVar29 ||
                          (vStack_2a0.
                           super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                           ._M_impl.super__Vector_impl_data._M_start[sVar30].changetime != iVar20)))
                         ) {
                        PartialUnion::addLabeledNodeOccurrence
                                  ((PartialUnion *)this_02,sVar30,iVar29,iVar20,&vStack_1f0,
                                   SUB41(uStack_26c,0),paVar14[uVar32]._M_elems[0] + -1);
                        paVar14 = (((PartialUnion *)this_02)->nodes).
                                  super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        paVar27 = (((PartialUnion *)this_02)->nodes).
                                  super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish;
                      }
                    }
                    uVar32 = uVar32 + 1;
                  } while (uVar32 < (ulong)(((long)paVar27 - (long)paVar14 >> 3) *
                                           -0x5555555555555555));
                }
              }
              if (vStack_1f0.
                  super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  vStack_1f0.
                  super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                lVar31 = 0;
                uVar32 = 0;
                plVar15 = vStack_1f0.
                          super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                plVar19 = vStack_1f0.
                          super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                do {
                  puVar23 = puStack_148;
                  uVar2 = *(undefined8 *)
                           ((long)&(plVar15->occurrences)._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count + lVar31);
                  auVar35._0_8_ = (double)CONCAT44(0x43300000,(int)uVar2);
                  auVar35._8_4_ = (int)((ulong)uVar2 >> 0x20);
                  auVar35._12_4_ = 0x45300000;
                  dStack_280 = 1.0 - ((auVar35._8_8_ - 1.9342813113834067e+25) +
                                     (auVar35._0_8_ - 4503599627370496.0)) / dStack_a0;
                  if (dStack_a8 <= dStack_280) {
                    _Stack_1d8._M_impl._0_4_ = *puStack_148 + 1;
                    *puStack_148 = _Stack_1d8._M_impl._0_4_;
                    _Stack_1d8._M_impl._4_4_ = 0;
                    _Stack_1d8._M_impl.super__Rb_tree_header._M_header._M_color =
                         *(_Rb_tree_color *)((long)&plVar15->label + lVar31);
                    _Stack_1d8._M_impl.super__Rb_tree_header._M_header._4_4_ =
                         *(undefined4 *)((long)&plVar15->changetime + lVar31);
                    iVar3._M_current = *(array<int,_4UL> **)(puStack_148 + 4);
                    if (iVar3._M_current == *(array<int,_4UL> **)(puStack_148 + 6)) {
                      std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>::
                      _M_realloc_insert<std::array<int,4ul>const&>
                                (pvStack_c8,iVar3,(array<int,_4UL> *)&_Stack_1d8);
                    }
                    else {
                      *(ulong *)(iVar3._M_current)->_M_elems = (ulong)(uint)_Stack_1d8._M_impl._0_4_
                      ;
                      *(ulong *)((iVar3._M_current)->_M_elems + 2) =
                           CONCAT44(_Stack_1d8._M_impl.super__Rb_tree_header._M_header._4_4_,
                                    _Stack_1d8._M_impl.super__Rb_tree_header._M_header._M_color);
                      *(long *)(puStack_148 + 4) = *(long *)(puStack_148 + 4) + 0x10;
                    }
                    iVar5._M_current = *(double **)(puVar23 + 0x1c);
                    if (iVar5._M_current == *(double **)(puVar23 + 0x1e)) {
                      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                                (pvStack_d0,iVar5,&dStack_280);
                    }
                    else {
                      *iVar5._M_current = dStack_280;
                      *(double **)(puVar23 + 0x1c) = iVar5._M_current + 1;
                    }
                    iVar6._M_current = *(int **)(puVar23 + 0x16);
                    if (iVar6._M_current == *(int **)(puVar23 + 0x18)) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                (pvStack_d8,iVar6,(int *)puStack_278);
                    }
                    else {
                      *iVar6._M_current = *puStack_278;
                      *(int **)(puVar23 + 0x16) = iVar6._M_current + 1;
                    }
                    iVar6._M_current = *(int **)(puVar23 + 0x10);
                    if (iVar6._M_current == *(int **)(puVar23 + 0x12)) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                (pvStack_e0,iVar6,(int *)puVar23);
                    }
                    else {
                      *iVar6._M_current = *puVar23;
                      *(int **)(puVar23 + 0x10) = iVar6._M_current + 1;
                    }
                    std::vector<int,std::allocator<int>>::
                    vector<std::_Rb_tree_const_iterator<int>,void>
                              ((vector<int,std::allocator<int>> *)auStack_260,
                               *(_Base_ptr *)
                                ((long)&((vStack_1f0.
                                          super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->occurrences).
                                        _M_t._M_impl.super__Rb_tree_header._M_header._M_left +
                                lVar31),(_Base_ptr)
                                        ((long)&((vStack_1f0.
                                                  super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                occurrences)._M_t._M_impl.super__Rb_tree_header.
                                                _M_header._M_color + lVar31),&aStack_2a1);
                    std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::push_back(pvStack_b0,(value_type *)auStack_260);
                    plVar15 = vStack_1f0.
                              super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    plVar19 = vStack_1f0.
                              super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                    if (auStack_260 != (undefined1  [8])0x0) {
                      operator_delete((void *)auStack_260);
                      plVar15 = vStack_1f0.
                                super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      plVar19 = vStack_1f0.
                                super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                    }
                  }
                  uVar32 = uVar32 + 1;
                  lVar31 = lVar31 + 0x70;
                } while (uVar32 < (ulong)(((long)plVar19 - (long)plVar15 >> 4) * 0x6db6db6db6db6db7)
                        );
              }
            }
            if (apvStack_80[0] != (void *)0x0) {
              operator_delete(apvStack_80[0]);
            }
            puVar23 = puStack_278;
            if (apvStack_98[0] != (void *)0x0) {
              operator_delete(apvStack_98[0]);
            }
          }
          std::
          _Hashtable<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&_Stack_128);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&_Stack_1a8);
          std::vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>::~vector
                    (&vStack_1f0);
          uVar32 = uStack_c0;
        }
      }
      sVar30 = sVar30 + 1;
    } while (sVar30 < (ulong)(((long)vStack_2a0.
                                     super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)vStack_2a0.
                                     super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4) *
                             0x6db6db6db6db6db7));
  }
  std::vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>::~vector(&vStack_2a0)
  ;
  return extraout_RAX;
}

Assistant:

size_t labeled_node::support(bool new_measures) {
	  	if (new_measures) {
		  	size_t new_support = 0;
			for (auto snapshotId : occurrences) {
			  	new_support += multiple_occurrences.at(snapshotId).size();
			}

		  	return new_support;
		}
	  	return occurrences.size();
	}